

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

int ref_nonsingle_cell(saucy *s,coloring *c,int cf)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int local_44;
  int local_40;
  int bmax;
  int bmin;
  int fb;
  int ff;
  int nzf;
  int cb;
  int i;
  int cnt;
  int cf_local;
  coloring *c_local;
  saucy *s_local;
  
  iVar3 = cf + c->clen[cf];
  iVar4 = (iVar3 - s->conncnts[cf]) + 1;
  local_44 = s->ccount[c->lab[iVar4]];
  s->count[iVar4] = local_44;
  s->bucket[local_44] = 1;
  local_40 = local_44;
  bmin = iVar4;
  while (bmin = bmin + 1, bmin <= iVar3) {
    iVar1 = s->ccount[c->lab[bmin]];
    while (iVar1 < local_40) {
      local_40 = local_40 + -1;
      s->bucket[local_40] = 0;
    }
    while (local_44 < iVar1) {
      local_44 = local_44 + 1;
      s->bucket[local_44] = 0;
    }
    s->bucket[iVar1] = s->bucket[iVar1] + 1;
    s->count[bmin] = iVar1;
  }
  if ((local_40 == local_44) && (cf == iVar4)) {
    s_local._4_4_ = 1;
  }
  else {
    bmin = iVar4;
    for (nzf = local_40; iVar1 = iVar4, nzf <= local_44; nzf = nzf + 1) {
      bmax = bmin;
      if (s->bucket[nzf] != 0) {
        bmax = bmin + s->bucket[nzf];
        s->bucket[nzf] = bmax;
      }
      bmin = bmax;
    }
    while (nzf = iVar1, nzf <= iVar3) {
      iVar1 = c->lab[nzf];
      piVar2 = s->junk;
      iVar5 = s->bucket[s->count[nzf]] + -1;
      s->bucket[s->count[nzf]] = iVar5;
      piVar2[iVar5] = iVar1;
      iVar1 = nzf + 1;
    }
    while (nzf = iVar4, nzf <= iVar3) {
      set_label(c,nzf,s->junk[nzf]);
      iVar4 = nzf + 1;
    }
    for (nzf = local_44; local_40 < nzf; nzf = nzf + -1) {
      if ((s->bucket[nzf] != 0) && (iVar4 = (*s->split)(s,c,cf,s->bucket[nzf]), iVar4 == 0)) {
        return 0;
      }
    }
    s_local._4_4_ = maybe_split(s,c,cf,s->bucket[local_40]);
  }
  return s_local._4_4_;
}

Assistant:

static int
ref_nonsingle_cell(struct saucy *s, struct coloring *c, int cf)
{
    int cnt, i, cb, nzf, ff, fb, bmin, bmax;

    /* Find the front and back */
    cb = cf + c->clen[cf];
    nzf = cb - s->conncnts[cf] + 1;

    /* Prepare the buckets */
    ff = nzf;
    cnt = s->ccount[c->lab[ff]];
    s->count[ff] = bmin = bmax = cnt;
    s->bucket[cnt] = 1;

    /* Iterate through the rest of the vertices */
    while (++ff <= cb) {
        cnt = s->ccount[c->lab[ff]];

        /* Initialize intermediate buckets */
        while (bmin > cnt) s->bucket[--bmin] = 0;
        while (bmax < cnt) s->bucket[++bmax] = 0;

        /* Mark this count */
        ++s->bucket[cnt];
        s->count[ff] = cnt;
    }

    /* If they all had the same count, bail */
    if (bmin == bmax && cf == nzf) return 1;
    ff = fb = nzf;

    /* Calculate bucket locations, sizes */
    for (i = bmin; i <= bmax; ++i, ff = fb) {
        if (!s->bucket[i]) continue;
        fb = ff + s->bucket[i];
        s->bucket[i] = fb;
    }

    /* Repair the partition nest */
    for (i = nzf; i <= cb; ++i) {
        s->junk[--s->bucket[s->count[i]]] = c->lab[i];
    }
    for (i = nzf; i <= cb; ++i) {
        set_label(c, i, s->junk[i]);
    }

    /* Split; induce */
    for (i = bmax; i > bmin; --i) {
        ff = s->bucket[i];
        if (ff && !s->split(s, c, cf, ff)) return 0;
    }

    /* If there was a zero area, then there's one more cell */
    return maybe_split(s, c, cf, s->bucket[bmin]);
}